

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

void __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
injector<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
          (injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
           *this,from_deps *param_1,
          dependency<boost::ext::di::v1_3_0::scopes::instance,_i1,_std::shared_ptr<i1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          *args)

{
  type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_i1,_std::shared_ptr<i1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_39;
  pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_i1,_std::shared_ptr<i1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_38;
  undefined8 local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_i1,_std::shared_ptr<i1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<i1,_std::shared_ptr<i1>,_int>.object_.
  super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super_scope<i1,_std::shared_ptr<i1>,_int>).object_.
       super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_i1,_std::shared_ptr<i1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<i1,_std::shared_ptr<i1>,_int>.object_.
  super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super_scope<i1,_std::shared_ptr<i1>,_int>).object_.
       super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (args->super_scope<i1,_std::shared_ptr<i1>,_int>).object_.
  super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (args->super_scope<i1,_std::shared_ptr<i1>,_int>).object_.
  super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20 = 0;
  pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
  ::
  pool<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
            ((pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,i1,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
              *)this,&local_39,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super_dependency<boost::ext::di::v1_3_0::scopes::instance,_i1,_std::shared_ptr<i1>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
              .super_scope<i1,_std::shared_ptr<i1>,_int>.object_.
              super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

operator T*() const {
      using constraint_not_satisfied = is_not_bound;
      return constraint_not_satisfied{}.error();
    }